

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep.cc
# Opt level: O3

void __thiscall
p2t::Sweep::FillLeftBelowEdgeEvent(Sweep *this,SweepContext *tcx,Edge *edge,Node *node)

{
  Point *pPVar1;
  Point *pPVar2;
  double dVar3;
  double dVar4;
  Point *pPVar5;
  double dVar6;
  
  pPVar5 = node->point;
  dVar6 = pPVar5->x;
  if (edge->p->x <= dVar6 && dVar6 != edge->p->x) {
    do {
      pPVar1 = node->prev->point;
      pPVar2 = node->prev->prev->point;
      dVar3 = pPVar2->x;
      dVar4 = pPVar2->y;
      dVar6 = (pPVar1->y - dVar4) * (dVar6 - dVar3) - (pPVar1->x - dVar3) * (pPVar5->y - dVar4);
      if ((1e-12 <= ABS(dVar6)) && (dVar6 <= 0.0)) {
        FillLeftConcaveEdgeEvent(this,tcx,edge,node);
        return;
      }
      FillLeftConvexEdgeEvent(this,tcx,edge,node);
      pPVar5 = node->point;
      dVar6 = pPVar5->x;
    } while (edge->p->x <= dVar6 && dVar6 != edge->p->x);
  }
  return;
}

Assistant:

void Sweep::FillLeftBelowEdgeEvent(SweepContext& tcx, Edge* edge, Node& node)
{
  if (node.point->x > edge->p->x) {
    if (Orient2d(*node.point, *node.prev->point, *node.prev->prev->point) == CW) {
      // Concave
      FillLeftConcaveEdgeEvent(tcx, edge, node);
    } else {
      // Convex
      FillLeftConvexEdgeEvent(tcx, edge, node);
      // Retry this one
      FillLeftBelowEdgeEvent(tcx, edge, node);
    }
  }
}